

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O2

int unfinished_tasks_test(TestArgsBase *TEST_args_base__)

{
  int __how;
  size_t ii;
  _func_void *p_Var1;
  int __fd;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  undefined1 local_288 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  undefined1 local_268 [16];
  mutex mm;
  EVP_PKEY_CTX local_228 [24];
  ThreadPoolMgr mgr;
  
  __fd = (int)&local_2a8;
  local_228[8] = (EVP_PKEY_CTX)0x64;
  local_228[9] = (EVP_PKEY_CTX)0x0;
  local_228[10] = (EVP_PKEY_CTX)0x0;
  local_228[0xb] = (EVP_PKEY_CTX)0x0;
  local_228[0xc] = (EVP_PKEY_CTX)0x0;
  local_228[0xd] = (EVP_PKEY_CTX)0x0;
  local_228[0xe] = (EVP_PKEY_CTX)0x0;
  local_228[0xf] = (EVP_PKEY_CTX)0x0;
  local_228[0x11] = (EVP_PKEY_CTX)0x1;
  local_228._0_8_ = TEST_args_base__[1].testName._M_dataplus._M_p;
  local_228[0x10] = *(EVP_PKEY_CTX *)&TEST_args_base__[1]._vptr_TestArgsBase;
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(&mgr);
  simple_thread_pool::ThreadPoolMgr::init(&mgr,local_228);
  TestSuite::_msgt("begin\n");
  mm.super___mutex_base._M_mutex._16_8_ = 0;
  mm.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mm.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mm.super___mutex_base._M_mutex.__align = 0;
  mm.super___mutex_base._M_mutex._8_8_ = 0;
  for (p_Var1 = (_func_void *)0x0; p_Var1 != (_func_void *)0xf; p_Var1 = p_Var1 + 1) {
    local_2a8._8_8_ = &mm;
    local_290 = std::
                _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:328:22)>
                ::_M_invoke;
    local_298 = std::
                _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:328:22)>
                ::_M_manager;
    local_2a8._M_unused._M_function_pointer = p_Var1;
    simple_thread_pool::ThreadPoolMgr::addTask
              ((ThreadPoolMgr *)local_268,(TaskHandler *)&mgr,(uint64_t)&local_2a8,ONE_TIME);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8));
    std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
  }
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_290 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:339:18)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:339:18)>
              ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)(local_288 + 0x10),(TaskHandler *)&mgr,(uint64_t)&local_2a8,20000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270);
  std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_290 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:347:18)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:347:18)>
              ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)local_288,(TaskHandler *)&mgr,(uint64_t)&local_2a8,500000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
  local_2a8._M_unused._M_object = &local_298;
  local_2a8._8_8_ = 0;
  local_298 = (code *)((ulong)local_298 & 0xffffffffffffff00);
  TestSuite::sleep_ms(0x32,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)local_2a8._M_pod_data);
  TestSuite::_msgt("shutdown thread pool\n");
  simple_thread_pool::ThreadPoolMgr::shutdown(&mgr,__fd,__how);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(&mgr);
  return 0;
}

Assistant:

int unfinished_tasks_test(PARAM_BASE) {
    GET_PARAMS(unfinished_tasks_test_params);

    ThreadPoolOptions opt;
    opt.numInitialThreads = unfinished_tasks_test_params->num_threads;
    opt.invokeCanceledTask = unfinished_tasks_test_params->cancel_flag;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    std::mutex mm;

    // 15 async tasks.
    for (size_t ii=0; ii<15; ++ii) {
        mgr.addTask( [ii, &mm](const TaskResult& ret) {
            std::lock_guard<std::mutex> l(mm);
            TestSuite::_msgt("[%02zx] async task %zu, result %d\n",
                             tid_simple(), ii, ret);
            if (ret.ok()) {
                TestSuite::sleep_ms(10);
            }
        } );
    }

    // Recurring timer whose interval is 20 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] recurring 20 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 20*1000,
                 TaskType::RECURRING );

    // One-time timer whose interval is 500 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] one-time 500 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 500000 );

    // Wait 50 ms.
    TestSuite::sleep_ms(50);

    // Shutdown thread pool.
    // If `opt.invokeCanceledTask = true`, unfinished tasks will be fired
    // with `CANCELED` result code. Otherwise, they will be just purged.
    TestSuite::_msgt("shutdown thread pool\n");
    mgr.shutdown();

    return 0;
}